

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ClockingDirectionSyntax *node;
  DefaultSkewItemSyntax *pDVar1;
  Token *unaff_retaddr;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000008;
  BumpAllocator *in_stack_00000010;
  BumpAllocator *in_stack_00000068;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000070;
  BumpAllocator *in_stack_00000108;
  Token *in_stack_00000110;
  Token *args_3;
  
  args_3 = (Token *)__child_stack;
  node = (ClockingDirectionSyntax *)
         deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000070,in_stack_00000068);
  parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  not_null<slang::syntax::ClockingDirectionSyntax_*>::operator*
            ((not_null<slang::syntax::ClockingDirectionSyntax_*> *)0x81830a);
  deepClone<slang::syntax::ClockingDirectionSyntax>(node,(BumpAllocator *)__child_stack);
  parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  pDVar1 = BumpAllocator::
           emplace<slang::syntax::DefaultSkewItemSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::ClockingDirectionSyntax&,slang::parsing::Token>
                     (in_stack_00000010,in_stack_00000008,unaff_retaddr,
                      (ClockingDirectionSyntax *)__fn,args_3);
  return (int)pDVar1;
}

Assistant:

static SyntaxNode* clone(const DefaultSkewItemSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<DefaultSkewItemSyntax>(
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        *deepClone<ClockingDirectionSyntax>(*node.direction, alloc),
        node.semi.deepClone(alloc)
    );
}